

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O0

void envy_bios_print_dcb(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_dcb *peVar1;
  envy_bios_dcb_entry *peVar2;
  char *pcVar3;
  char *pcVar4;
  int local_50;
  uint local_4c;
  int j_1;
  int j;
  char *lvdsinfo;
  char *typename;
  envy_bios_dcb_entry *entry;
  int i;
  envy_bios_dcb *dcb;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->dcb;
  if ((peVar1->offset != 0) && ((mask & 0x10000) != 0)) {
    if ((bios->dcb).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse DCB table at 0x%04x version %d.%d\n\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->dcb).version >> 4),
              (ulong)((bios->dcb).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"DCB table at 0x%04x version %d.%d",(ulong)peVar1->offset,
              (ulong)(uint)((int)(uint)(bios->dcb).version >> 4),(ulong)((bios->dcb).version & 0xf))
      ;
      if (0x2f < (bios->dcb).version) {
        fprintf((FILE *)out," unk16 0x%02x",(ulong)(bios->dcb).unk16);
      }
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->dcb).hlen,mask);
      for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)(bios->dcb).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar2 = (bios->dcb).entries + (int)entry._4_4_;
        if ((peVar2->type != '\x0f') || ((mask & 0x40000000) != 0)) {
          fprintf((FILE *)out,"DCB %d:",(ulong)entry._4_4_);
          if (0x13 < (bios->dcb).version) {
            pcVar3 = find_enum(dcb_types,(uint)peVar2->type);
            pcVar4 = find_enum(dcb_lvds_info_types,(uint)peVar2->lvds_info);
            fprintf((FILE *)out," type %d [%s]",(ulong)peVar2->type,pcVar3);
            if ((peVar2->type != '\x0e') && (peVar2->type != '\x0f')) {
              if (peVar2->i2c != '\x0f') {
                fprintf((FILE *)out," I2C %d",(ulong)peVar2->i2c);
              }
              if (peVar2->heads != '\0') {
                fprintf((FILE *)out," heads");
                for (local_4c = 0; (int)local_4c < 4; local_4c = local_4c + 1) {
                  if (((uint)peVar2->heads & 1 << ((byte)local_4c & 0x1f)) != 0) {
                    fprintf((FILE *)out," %d",(ulong)local_4c);
                  }
                }
              }
              if (peVar2->unk00_4 != '\0') {
                fprintf((FILE *)out," unk00_4 %d",(ulong)peVar2->unk00_4);
              }
              if (((bios->dcb).version < 0x30) ||
                 ((bios->conn).entries == (envy_bios_conn_entry *)0x0)) {
                if (peVar2->unk01_4 != '\0') {
                  fprintf((FILE *)out," unk01_4 %d",(ulong)peVar2->unk01_4);
                }
              }
              else {
                fprintf((FILE *)out," CONN %d [0x%02x]",(ulong)peVar2->conn,
                        (ulong)(bios->conn).entries[peVar2->conn].type);
              }
              fprintf((FILE *)out," conntag %d",(ulong)peVar2->conntag);
              if (peVar2->loc == '\0') {
                fprintf((FILE *)out," LOCAL");
              }
              else if (peVar2->loc == '\x01') {
                fprintf((FILE *)out," EXT %d",(ulong)peVar2->ext_addr);
              }
              else {
                fprintf((FILE *)out," unk loc %d",(ulong)peVar2->loc);
              }
              if ((peVar2->ext_addr != '\0') && (peVar2->loc != '\x01')) {
                fprintf((FILE *)out," unk_ext_addr %d",(ulong)peVar2->ext_addr);
              }
              if (peVar2->unk02_6 != '\0') {
                fprintf((FILE *)out," unk02_6 %d",(ulong)peVar2->unk02_6);
              }
              if (peVar2->or != '\0') {
                fprintf((FILE *)out," OR");
                for (local_4c = 0; (int)local_4c < 4; local_4c = local_4c + 1) {
                  if (((uint)peVar2->or & 1 << ((byte)local_4c & 0x1f)) != 0) {
                    fprintf((FILE *)out," %d",(ulong)local_4c);
                  }
                }
              }
              if (peVar2->unk03_4 != '\0') {
                fprintf((FILE *)out," unk03_4 %d",(ulong)peVar2->unk03_4);
              }
              if ((((peVar2->type == '\x03') || (peVar2->type == '\x02')) ||
                  (peVar2->type == '\x06')) && (0x3f < (bios->dcb).version)) {
                fprintf((FILE *)out," links");
                for (local_4c = 0; (int)local_4c < 2; local_4c = local_4c + 1) {
                  if (((uint)peVar2->links & 1 << ((byte)local_4c & 0x1f)) != 0) {
                    fprintf((FILE *)out," %d",(ulong)local_4c);
                  }
                }
              }
              if (peVar2->maxfreq != 0) {
                fprintf((FILE *)out," maxfreq %dkHz",(ulong)peVar2->maxfreq);
              }
              if (peVar2->tmds_hdmi != '\0') {
                fprintf((FILE *)out," HDMI");
              }
              if (peVar2->type == '\x03') {
                fprintf((FILE *)out," INFO %s",pcVar4);
                fprintf((FILE *)out," POWER %d",(ulong)peVar2->lvds_pscript);
              }
              if (peVar2->type == '\x06') {
                if (peVar2->dp_bw == '\0') {
                  fprintf((FILE *)out," BW 162000");
                }
                else if (peVar2->dp_bw == '\x01') {
                  fprintf((FILE *)out," BW 270000");
                }
                else {
                  fprintf((FILE *)out," BW UNK%d",(ulong)peVar2->dp_bw);
                }
                fprintf((FILE *)out," lanes");
                for (local_4c = 0; (int)local_4c < 4; local_4c = local_4c + 1) {
                  if (((uint)peVar2->dp_lanes & 1 << ((byte)local_4c & 0x1f)) != 0) {
                    fprintf((FILE *)out," %d",(ulong)local_4c);
                  }
                }
              }
              if (peVar2->unk04 != '\0') {
                fprintf((FILE *)out," unk04 0x%02x",(ulong)peVar2->unk04);
              }
              if (peVar2->unk05 != '\0') {
                fprintf((FILE *)out," unk05 0x%02x",(ulong)peVar2->unk05);
              }
              if (peVar2->unk06 != '\0') {
                fprintf((FILE *)out," unk06 0x%02x",(ulong)peVar2->unk06);
              }
              if (peVar2->unk07 != '\0') {
                fprintf((FILE *)out," unk07 0x%02x",(ulong)peVar2->unk07);
              }
            }
          }
          fprintf((FILE *)out,"\n");
        }
        envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->dcb).rlen,mask);
      }
      fprintf((FILE *)out,"\n");
      if (bios->dev_rec_offset != 0) {
        fprintf((FILE *)out,"DEV_REC at 0x%04x\n",(ulong)bios->dev_rec_offset);
        envy_bios_dump_hex(bios,out,bios->dev_rec_offset,7,mask);
        fprintf((FILE *)out,"\n");
      }
      if ((bios->dcb).rdcb_valid != '\0') {
        fprintf((FILE *)out,"RDCB table at 0x%04x version %d.%d",(ulong)peVar1->offset,
                (ulong)(uint)((int)(uint)(bios->dcb).rdcb_version >> 4),
                (ulong)((bios->dcb).rdcb_version & 0xf));
        if (((bios->dcb).tvdac0_present != '\0') &&
           (fprintf((FILE *)out," TVDAC0 line %d",(ulong)(bios->dcb).tvdac0_line),
           (bios->dcb).tvdac0_neg != '\0')) {
          fprintf((FILE *)out," NEG");
        }
        if ((bios->dcb).rdcb_unk04_0 != '\0') {
          fprintf((FILE *)out," unk04_0 %d",(ulong)(bios->dcb).rdcb_unk04_0);
        }
        if ((bios->dcb).rdcb_unk05_2 != '\0') {
          fprintf((FILE *)out," unk05_2 %d",(ulong)(bios->dcb).rdcb_unk05_2);
        }
        for (local_50 = 0; local_50 < 7; local_50 = local_50 + 1) {
          if ((bios->dcb).rdcb_unk06[local_50] != '\0') {
            fprintf((FILE *)out," unk0x%02x 0x%02x",(ulong)(local_50 + 6),
                    (ulong)(bios->dcb).rdcb_unk06[local_50]);
          }
        }
        if ((bios->dcb).rdcb_unk0d != '\0') {
          fprintf((FILE *)out," unk0d 0x%02x",(ulong)(bios->dcb).rdcb_unk0d);
        }
        for (local_50 = 0; local_50 < 0xd; local_50 = local_50 + 1) {
          if ((bios->dcb).rdcb_unk10[local_50] != '\0') {
            fprintf((FILE *)out," unk0x%02x 0x%02x",(ulong)(local_50 + 0x10),
                    (ulong)(bios->dcb).rdcb_unk10[local_50]);
          }
        }
        fprintf((FILE *)out,"\n");
        envy_bios_dump_hex(bios,out,(uint)peVar1->offset - (uint)(bios->dcb).rdcb_len,
                           (uint)(bios->dcb).rdcb_len,mask);
        fprintf((FILE *)out,"\n");
      }
    }
  }
  return;
}

Assistant:

void envy_bios_print_dcb (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	if (!dcb->offset || !(mask & ENVY_BIOS_PRINT_DCB))
		return;
	if (!dcb->valid) {
		fprintf(out, "Failed to parse DCB table at 0x%04x version %d.%d\n\n", dcb->offset, dcb->version >> 4, dcb->version & 0xf);
		return;
	}
	fprintf(out, "DCB table at 0x%04x version %d.%d", dcb->offset, dcb->version >> 4, dcb->version & 0xf);
	if (dcb->version >= 0x30)
		fprintf(out, " unk16 0x%02x", dcb->unk16);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, dcb->offset, dcb->hlen, mask);
	int i;
	for (i = 0; i < dcb->entriesnum; i++) {
		struct envy_bios_dcb_entry *entry = &dcb->entries[i];
		if (entry->type != ENVY_BIOS_DCB_UNUSED || mask & ENVY_BIOS_PRINT_UNUSED) {
			fprintf(out, "DCB %d:", i);
			if (dcb->version >= 0x14) {
				const char *typename = find_enum(dcb_types, entry->type);
				const char *lvdsinfo = find_enum(dcb_lvds_info_types, entry->lvds_info);
				fprintf(out, " type %d [%s]", entry->type, typename);
				if (entry->type != ENVY_BIOS_DCB_EOL && entry->type != ENVY_BIOS_DCB_UNUSED) {
					if (entry->i2c != 15)
						fprintf(out, " I2C %d", entry->i2c);
					int j;
					if (entry->heads) {
						fprintf(out, " heads");
						for (j = 0; j < 4; j++)
							if (entry->heads & 1 << j)
								fprintf(out, " %d", j);
					}
					if (entry->unk00_4)
						fprintf(out, " unk00_4 %d", entry->unk00_4);
					if (dcb->version >= 0x30 && bios->conn.entries)
						fprintf(out, " CONN %d [0x%02x]", entry->conn, bios->conn.entries[entry->conn].type);
					else if (entry->unk01_4)
						fprintf(out, " unk01_4 %d", entry->unk01_4);
					fprintf(out, " conntag %d", entry->conntag);
					switch (entry->loc) {
						case 0:
							fprintf(out, " LOCAL");
							break;
						case 1:
							fprintf(out, " EXT %d", entry->ext_addr);
							break;
						default:
							fprintf(out, " unk loc %d", entry->loc);
							break;
					}
					if (entry->ext_addr && entry->loc != 1)
						fprintf(out, " unk_ext_addr %d", entry->ext_addr);
					if (entry->unk02_6)
						fprintf(out, " unk02_6 %d", entry->unk02_6);
					if (entry->or) {
						fprintf(out, " OR");
						for (j = 0; j < 4; j++)
							if (entry->or & 1 << j)
								fprintf(out, " %d", j);
					}
					if (entry->unk03_4)
						fprintf(out, " unk03_4 %d", entry->unk03_4);
					if ((entry->type == ENVY_BIOS_DCB_LVDS || entry->type == ENVY_BIOS_DCB_TMDS || entry->type == ENVY_BIOS_DCB_DP) && dcb->version >= 0x40) {
						fprintf(out, " links");
						for (j = 0; j < 2; j++)
							if (entry->links & 1 << j)
								fprintf(out, " %d", j);
					}
					if (entry->maxfreq)
						fprintf(out, " maxfreq %dkHz", entry->maxfreq);
					if (entry->tmds_hdmi)
						fprintf(out, " HDMI");
					if (entry->type == ENVY_BIOS_DCB_LVDS) {
						fprintf(out, " INFO %s", lvdsinfo);
						fprintf(out, " POWER %d", entry->lvds_pscript);
					}
					if (entry->type == ENVY_BIOS_DCB_DP) {
						switch (entry->dp_bw) {
							case 0:
								fprintf(out, " BW 162000");
								break;
							case 1:
								fprintf(out, " BW 270000");
								break;
							default:
								fprintf(out, " BW UNK%d", entry->dp_bw);
								break;
						}
						fprintf(out, " lanes");
						for (j = 0; j < 4; j++)
							if (entry->dp_lanes & 1 << j)
								fprintf(out, " %d", j);
					}
					if (entry->unk04)
						fprintf(out, " unk04 0x%02x", entry->unk04);
					if (entry->unk05)
						fprintf(out, " unk05 0x%02x", entry->unk05);
					if (entry->unk06)
						fprintf(out, " unk06 0x%02x", entry->unk06);
					if (entry->unk07)
						fprintf(out, " unk07 0x%02x", entry->unk07);
				}
			} else {
				/* XXX */
			}
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, dcb->rlen, mask);
	}
	fprintf(out, "\n");
	if (bios->dev_rec_offset) {
		fprintf(out, "DEV_REC at 0x%04x\n", bios->dev_rec_offset);
		envy_bios_dump_hex(bios, out, bios->dev_rec_offset, 7, mask);
		fprintf(out, "\n");
	}
	if (dcb->rdcb_valid) {
		fprintf(out, "RDCB table at 0x%04x version %d.%d", dcb->offset, dcb->rdcb_version >> 4, dcb->rdcb_version & 0xf);
		if (dcb->tvdac0_present) {
			fprintf(out, " TVDAC0 line %d", dcb->tvdac0_line);
			if (dcb->tvdac0_neg)
				fprintf(out, " NEG");
		}
		if (dcb->rdcb_unk04_0)
			fprintf(out, " unk04_0 %d", dcb->rdcb_unk04_0);
		if (dcb->rdcb_unk05_2)
			fprintf(out, " unk05_2 %d", dcb->rdcb_unk05_2);
		int j;
		for (j = 0; j < 7; j++) {
			if (dcb->rdcb_unk06[j])
				fprintf(out, " unk0x%02x 0x%02x", j+6, dcb->rdcb_unk06[j]);
		}
		if (dcb->rdcb_unk0d)
			fprintf(out, " unk0d 0x%02x", dcb->rdcb_unk0d);
		for (j = 0; j < 13; j++) {
			if (dcb->rdcb_unk10[j])
				fprintf(out, " unk0x%02x 0x%02x", j+0x10, dcb->rdcb_unk10[j]);
		}
		fprintf(out, "\n");
		envy_bios_dump_hex(bios, out, dcb->offset - dcb->rdcb_len, dcb->rdcb_len, mask);
		fprintf(out, "\n");
	}
}